

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::Simulator::set_i(Simulator *this,Var *var,optional<long> value,bool eval_)

{
  char *__file;
  Var *var_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  optional<unsigned_long> op_value;
  optional<unsigned_long> local_50;
  char *local_40;
  uint64_t u_v;
  long v;
  Var *pVStack_28;
  bool eval__local;
  Var *var_local;
  Simulator *this_local;
  optional<long> value_local;
  
  this_local = value.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
  value_local.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value._0_1_ =
       value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_engaged;
  v._7_1_ = eval_;
  pVStack_28 = var;
  var_local = (Var *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (bVar1) {
    plVar4 = std::optional<long>::operator*((optional<long> *)&this_local);
    __file = (char *)*plVar4;
    local_40 = __file;
    u_v = (uint64_t)__file;
    uVar2 = (*(pVStack_28->super_IRNode)._vptr_IRNode[7])();
    iVar3 = truncate(__file,(ulong)uVar2);
    var_00 = pVStack_28;
    local_40 = (char *)CONCAT44(extraout_var,iVar3);
    std::optional<unsigned_long>::optional<unsigned_long_&,_true>
              (&local_50,(unsigned_long *)&local_40);
    op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ = 0;
    op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         local_50.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
         local_50.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    set_value_(this,var_00,op_value);
    if ((v._7_1_ & 1) != 0) {
      eval(this);
    }
  }
  return;
}

Assistant:

void Simulator::set_i(const kratos::Var *var, std::optional<int64_t> value, bool eval_) {
    if (value) {
        auto v = *value;
        auto u_v = *(reinterpret_cast<uint64_t *>(&v));
        u_v = truncate(u_v, var->width());
        set_value_(var, u_v);
        if (eval_) eval();
    }
}